

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exec-vary.c
# Opt level: O3

void finalize_target_page_bits_mips64(uc_struct_conflict6 *uc)

{
  return;
}

Assistant:

void finalize_target_page_bits(struct uc_struct *uc)
{
#ifdef TARGET_PAGE_BITS_VARY
    if (uc->init_target_page == NULL) {
        uc->init_target_page = calloc(1, sizeof(TargetPageBits));
    } else {
        return;
    }

    if (uc->target_bits != 0) {
        uc->init_target_page->bits = uc->target_bits;
    }

    if (uc->init_target_page->bits == 0) {
        uc->init_target_page->bits = TARGET_PAGE_BITS_MIN;
    }
    uc->init_target_page->mask = ((target_ulong)-1) << uc->init_target_page->bits;
    uc->init_target_page->decided = true;

    /*
     * For the benefit of an -flto build, prevent the compiler from
     * hoisting a read from target_page before we finish initializing.
     */
    barrier();
#endif
}